

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track.c
# Opt level: O2

void save_track(memfile *mf)

{
  long lVar1;
  
  mtag(mf,0,MTAG_TRACK);
  for (lVar1 = 0; lVar1 != 0x32; lVar1 = lVar1 + 1) {
    mwrite8(mf,utrack[lVar1].x);
    mwrite8(mf,utrack[lVar1].y);
  }
  mwrite32(mf,utcnt);
  mwrite32(mf,utpnt);
  return;
}

Assistant:

void save_track(struct memfile *mf)
{
    int i;
    mtag(mf, 0, MTAG_TRACK);
    for (i = 0; i < UTSZ; i++) {
	mwrite8(mf, utrack[i].x);
	mwrite8(mf, utrack[i].y);
    }
    mwrite32(mf, utcnt);
    mwrite32(mf, utpnt);
}